

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcpuid_util.c
# Opt level: O1

void debugf(int verboselevel,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  char buff [1024];
  undefined8 local_4e8;
  void **local_4e0;
  undefined1 *local_4d8;
  undefined1 local_4c8 [16];
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  char local_418 [1032];
  
  if (in_AL != '\0') {
    local_498 = in_XMM0_Qa;
    local_488 = in_XMM1_Qa;
    local_478 = in_XMM2_Qa;
    local_468 = in_XMM3_Qa;
    local_458 = in_XMM4_Qa;
    local_448 = in_XMM5_Qa;
    local_438 = in_XMM6_Qa;
    local_428 = in_XMM7_Qa;
  }
  if ((_warn_fun != (libcpuid_warn_fn_t)0x0) && (verboselevel <= _current_verboselevel)) {
    local_4d8 = local_4c8;
    local_4e0 = &va[0].overflow_arg_area;
    local_4e8 = 0x3000000010;
    local_4b8 = in_RDX;
    local_4b0 = in_RCX;
    local_4a8 = in_R8;
    local_4a0 = in_R9;
    vsnprintf(local_418,0x400,format,&local_4e8);
    (*_warn_fun)(local_418);
  }
  return;
}

Assistant:

void debugf(int verboselevel, const char* format, ...)
{
	char buff[1024];
	va_list va;
	if (!_warn_fun || (verboselevel > _current_verboselevel)) return;
	va_start(va, format);
	vsnprintf(buff, sizeof(buff), format, va);
	va_end(va);
	_warn_fun(buff);
}